

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

size_t mbedtls_mpi_bitlen(mbedtls_mpi *X)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar2 = X->n;
  if (sVar2 == 0) {
    return 0;
  }
  sVar3 = sVar2 << 6;
  do {
    sVar4 = sVar3;
    sVar2 = sVar2 - 1;
    if (sVar2 == 0) break;
    sVar3 = sVar4 - 0x40;
  } while (X->p[sVar2] == 0);
  uVar5 = 0x3f;
  do {
    sVar3 = sVar4;
    if (uVar5 == 0xffffffffffffffff) {
      return sVar3;
    }
    sVar4 = sVar4 - 1;
    uVar1 = uVar5 & 0x3f;
    uVar5 = uVar5 - 1;
  } while ((X->p[sVar2] >> uVar1 & 1) == 0);
  return sVar3;
}

Assistant:

size_t mbedtls_mpi_bitlen( const mbedtls_mpi *X )
{
    size_t i, j;

    if( X->n == 0 )
        return( 0 );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;

    for( j = biL; j > 0; j-- )
        if( ( ( X->p[i] >> ( j - 1 ) ) & 1 ) != 0 )
            break;

    return( ( i * biL ) + j );
}